

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O1

int Mvc_CoverCountLiterals(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Mvc_Cube_t *pMVar5;
  
  if (0 < pCover->nBits) {
    pMVar1 = (pCover->lCubes).pHead;
    iVar2 = 0;
    uVar3 = 0;
    do {
      iVar4 = 0;
      if (pMVar1 != (Mvc_Cube_t *)0x0) {
        iVar4 = 0;
        pMVar5 = pMVar1;
        do {
          iVar4 = iVar4 + (uint)((pMVar5->pData[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
          pMVar5 = pMVar5->pNext;
        } while (pMVar5 != (Mvc_Cube_t *)0x0);
      }
      iVar2 = iVar2 + iVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 != pCover->nBits);
    return iVar2;
  }
  return 0;
}

Assistant:

int Mvc_CoverCountLiterals( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, CounterTot, CounterCur;

    // allocate/clean the storage for literals
//    Mvc_CoverAllocateArrayLits( pCover );
//    memset( pCover->pLits, 0, pCover->nBits * sizeof(int) );
    // go through each literal
    CounterTot = 0;
    for ( i = 0; i < pCover->nBits; i++ )
    {
        // get the word and bit of this literal
        nWord = Mvc_CubeWhichWord(i);
        nBit  = Mvc_CubeWhichBit(i);
        // go through all the cubes
        CounterCur = 0;
        Mvc_CoverForEachCube( pCover, pCube )
            if ( pCube->pData[nWord] & (1<<nBit) )
                CounterCur++;
        CounterTot += CounterCur;
    }
    return CounterTot;
}